

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  char cVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pIVar7;
  pointer pTVar8;
  pointer pTVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  undefined1 local_338 [8];
  __single_object expr_4;
  Location local_2e8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c2;
  allocator<char> local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  iterator local_2a0;
  size_type local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  Enum local_278;
  Enum local_274;
  undefined1 local_270 [8];
  Var var;
  undefined1 local_1d8 [8];
  CatchVector catches;
  __single_object expr_3;
  Location local_170;
  Enum local_150;
  Enum local_14c;
  Enum local_148;
  Enum local_144;
  undefined1 local_140 [8];
  __single_object expr_2;
  undefined1 local_e8 [8];
  __single_object expr_1;
  int local_90;
  undefined1 local_88 [8];
  __single_object expr;
  undefined1 local_40 [8];
  Location loc;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  loc.field_1._8_8_ = out_expr;
  GetLocation((Location *)local_40,this);
  TVar3 = Peek(this,0);
  if (TVar3 == Block) {
    Consume((Token *)&expr,this);
    std::make_unique<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Location&>((Location *)local_88);
    pBVar5 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
             ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                           *)local_88);
    RVar4 = ParseLabelOpt(this,&(pBVar5->block).label);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      pBVar5 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
               ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                             *)local_88);
      RVar4 = ParseBlock(this,&pBVar5->block);
      bVar2 = Failed(RVar4);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        RVar4 = Expect(this,End);
        bVar2 = Failed(RVar4);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          pBVar5 = std::
                   unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                   ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                                 *)local_88);
          RVar4 = ParseEndLabelOpt(this,&(pBVar5->block).label);
          bVar2 = Failed(RVar4);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                      ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                       (unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                        *)local_88);
            local_90 = 2;
          }
        }
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
    ::~unique_ptr((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                   *)local_88);
  }
  else if (TVar3 == If) {
    Consume((Token *)&expr_2,this);
    std::make_unique<wabt::IfExpr,wabt::Location&>((Location *)local_140);
    pIVar7 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                       ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_140);
    local_144 = (Enum)ParseLabelOpt(this,&(pIVar7->true_).label);
    bVar2 = Failed((Result)local_144);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      pIVar7 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                         ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_140)
      ;
      local_148 = (Enum)ParseBlock(this,&pIVar7->true_);
      bVar2 = Failed((Result)local_148);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        bVar2 = Match(this,Else);
        if (bVar2) {
          pIVar7 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                             ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                              local_140);
          local_14c = (Enum)ParseEndLabelOpt(this,&(pIVar7->true_).label);
          bVar2 = Failed((Result)local_14c);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            pIVar7 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                               ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                                local_140);
            local_150 = (Enum)ParseTerminatingInstrList(this,&pIVar7->false_);
            bVar2 = Failed((Result)local_150);
            if (!bVar2) {
              GetLocation(&local_170,this);
              pIVar7 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                                 ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                                  local_140);
              (pIVar7->false_end_loc).filename._M_len = local_170.filename._M_len;
              (pIVar7->false_end_loc).filename._M_str = local_170.filename._M_str;
              (pIVar7->false_end_loc).field_1.field_1.offset =
                   (size_t)local_170.field_1.field_1.offset;
              *(undefined8 *)((long)&(pIVar7->false_end_loc).field_1 + 8) = local_170.field_1._8_8_;
              goto LAB_0019195d;
            }
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
        }
        else {
LAB_0019195d:
          RVar4 = Expect(this,End);
          bVar2 = Failed(RVar4);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            pIVar7 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                               ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                                local_140);
            RVar4 = ParseEndLabelOpt(this,&(pIVar7->true_).label);
            bVar2 = Failed(RVar4);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_90 = 1;
            }
            else {
              std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                        ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_
                         ,(unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_140)
              ;
              local_90 = 2;
            }
          }
        }
      }
    }
    std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::~unique_ptr
              ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_140);
  }
  else if (TVar3 == Loop) {
    Consume((Token *)&expr_1,this);
    std::make_unique<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Location&>((Location *)local_e8);
    pBVar6 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
             ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                           *)local_e8);
    RVar4 = ParseLabelOpt(this,&(pBVar6->block).label);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      pBVar6 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
               ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                             *)local_e8);
      RVar4 = ParseBlock(this,&pBVar6->block);
      bVar2 = Failed(RVar4);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        RVar4 = Expect(this,End);
        bVar2 = Failed(RVar4);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          pBVar6 = std::
                   unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                   ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                                 *)local_e8);
          RVar4 = ParseEndLabelOpt(this,&(pBVar6->block).label);
          bVar2 = Failed(RVar4);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                      ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                       (unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                        *)local_e8);
            local_90 = 2;
          }
        }
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
    ::~unique_ptr((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                   *)local_e8);
  }
  else {
    if (TVar3 == Try) {
      Consume((Token *)&expr_3,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)&expr_3);
      std::make_unique<wabt::TryExpr,wabt::Location&>
                ((Location *)
                 &catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::vector
                ((vector<wabt::Catch,_std::allocator<wabt::Catch>_> *)local_1d8);
      pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                         ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                          &catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      RVar4 = ParseLabelOpt(this,&(pTVar8->block).label);
      bVar2 = Failed(RVar4);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        cVar1 = '\x01';
      }
      else {
        pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                           ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                            &catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        RVar4 = ParseBlock(this,&pTVar8->block);
        bVar2 = Failed(RVar4);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          cVar1 = '\x01';
        }
        else {
          TVar3 = Peek(this,0);
          bVar2 = anon_unknown_1::IsCatch(TVar3);
          if (bVar2) {
            pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                               ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                                &catches.
                                 super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            RVar4 = ParseCatchInstrList(this,&pTVar8->catches);
            bVar2 = Failed(RVar4);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              cVar1 = '\x01';
              goto LAB_00191ef8;
            }
            pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                               ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                                &catches.
                                 super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            pTVar8->kind = Catch;
          }
          else {
            bVar2 = PeekMatch(this,Delegate,0);
            if (bVar2) {
              Consume((Token *)((long)&var.field_2 + 0x18),this);
              Var::Var((Var *)local_270);
              local_274 = (Enum)ParseVar(this,(Var *)local_270);
              cVar1 = Failed((Result)local_274);
              if ((bool)cVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
              }
              else {
                pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                         operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                     *)&catches.
                                        super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                Var::operator=(&pTVar8->delegate_target,(Var *)local_270);
                pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                         operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                     *)&catches.
                                        super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pTVar8->kind = Delegate;
              }
              Var::~Var((Var *)local_270);
              if ((bool)cVar1) goto LAB_00191ef8;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c0,"a valid try clause",&local_2c1);
          local_2a0 = &local_2c0;
          local_298 = 1;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_2c2);
          __l._M_len = local_298;
          __l._M_array = local_2a0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_290,__l,&local_2c2);
          local_278 = (Enum)ErrorIfLpar(this,&local_290,(char *)0x0);
          bVar2 = Failed((Result)local_278);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_290);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_2c2);
          local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_2a0;
          do {
            local_368 = local_368 + -1;
            std::__cxx11::string::~string((string *)local_368);
          } while (local_368 != &local_2c0);
          std::allocator<char>::~allocator(&local_2c1);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            cVar1 = '\x01';
          }
          else {
            GetLocation(&local_2e8,this);
            pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                               ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                                &catches.
                                 super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            (pTVar8->block).end_loc.filename._M_len = local_2e8.filename._M_len;
            (pTVar8->block).end_loc.filename._M_str = local_2e8.filename._M_str;
            (pTVar8->block).end_loc.field_1.field_1.offset =
                 (size_t)local_2e8.field_1.field_1.offset;
            *(undefined8 *)((long)&(pTVar8->block).end_loc.field_1 + 8) = local_2e8.field_1._8_8_;
            pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                               ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                                &catches.
                                 super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (pTVar8->kind != Delegate) {
              RVar4 = Expect(this,End);
              bVar2 = Failed(RVar4);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                cVar1 = '\x01';
                goto LAB_00191ef8;
              }
            }
            pTVar8 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                               ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                                &catches.
                                 super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            RVar4 = ParseEndLabelOpt(this,&(pTVar8->block).label);
            bVar2 = Failed(RVar4);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              cVar1 = '\x01';
            }
            else {
              std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                        ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_
                         ,(unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                          &catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
              cVar1 = '\x02';
            }
          }
        }
      }
LAB_00191ef8:
      std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector
                ((vector<wabt::Catch,_std::allocator<wabt::Catch>_> *)local_1d8);
      std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::~unique_ptr
                ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                 &catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (cVar1 == '\x01') {
        return (Result)this_local._4_4_;
      }
      goto LAB_001921be;
    }
    if (TVar3 != TryTable) {
      __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                    ,0xc36,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)");
    }
    Consume((Token *)&expr_4,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_4);
    std::make_unique<wabt::TryTableExpr,wabt::Location&>((Location *)local_338);
    pTVar9 = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::
             operator->((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_> *)
                        local_338);
    RVar4 = ParseLabelOpt(this,&(pTVar9->block).label);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      pTVar9 = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::
               operator->((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                           *)local_338);
      RVar4 = ParseBlockDeclaration(this,&(pTVar9->block).decl);
      bVar2 = Failed(RVar4);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        pTVar9 = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::
                 operator->((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                             *)local_338);
        RVar4 = ParseTryTableCatches(this,&pTVar9->catches);
        bVar2 = Failed(RVar4);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          pTVar9 = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::
                   operator->((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                               *)local_338);
          RVar4 = ParseInstrList(this,&(pTVar9->block).exprs);
          bVar2 = Failed(RVar4);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            RVar4 = Expect(this,End);
            bVar2 = Failed(RVar4);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_90 = 1;
            }
            else {
              pTVar9 = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                       ::operator->((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                                     *)local_338);
              RVar4 = ParseEndLabelOpt(this,&(pTVar9->block).label);
              bVar2 = Failed(RVar4);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_90 = 1;
              }
              else {
                std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                          ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)
                           loc.field_1._8_8_,
                           (unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                            *)local_338);
                local_90 = 2;
              }
            }
          }
        }
      }
    }
    std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::~unique_ptr
              ((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_> *)local_338
              );
  }
  if (local_90 == 1) {
    return (Result)this_local._4_4_;
  }
LAB_001921be:
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = std::make_unique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = std::make_unique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = std::make_unique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<TryExpr>(loc);
      CatchVector catches;
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      if (IsCatch(Peek())) {
        CHECK_RESULT(ParseCatchInstrList(&expr->catches));
        expr->kind = TryKind::Catch;
      } else if (PeekMatch(TokenType::Delegate)) {
        Consume();
        Var var;
        CHECK_RESULT(ParseVar(&var));
        expr->delegate_target = var;
        expr->kind = TryKind::Delegate;
      }
      CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
      expr->block.end_loc = GetLocation();
      if (expr->kind != TryKind::Delegate) {
        EXPECT(End);
      }
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::TryTable: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<TryTableExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
      CHECK_RESULT(ParseTryTableCatches(&expr->catches));
      CHECK_RESULT(ParseInstrList(&expr->block.exprs));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}